

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O0

int __thiscall ReadData::ReadGPSEph(ReadData *this,BUFF *socketdata,uchar *HeadBuff)

{
  bool bVar1;
  ushort uVar2;
  int iVar3;
  uchar *Message;
  ulong uVar4;
  double dVar5;
  unsigned_short prn;
  char *buff;
  uchar *HeadBuff_local;
  BUFF *socketdata_local;
  ReadData *this_local;
  
  if ((this->Head).MessageID == 7) {
    if (socketdata->len - socketdata->pos < (this->Head).MessageLength) {
      socketdata->pos = socketdata->pos + -0x1c;
      this_local._4_4_ = 2;
    }
    else {
      uVar4 = (ulong)((this->Head).MessageLength + 4);
      if ((long)uVar4 < 0) {
        uVar4 = 0xffffffffffffffff;
      }
      Message = (uchar *)operator_new__(uVar4);
      memcpy(Message,socketdata->buff + socketdata->pos,(long)((this->Head).MessageLength + 4));
      socketdata->pos = (this->Head).MessageLength + 4 + socketdata->pos;
      iVar3 = (this->Head).MessageLength;
      bVar1 = CRCCheck(HeadBuff,Message,iVar3,iVar3);
      if (bVar1) {
        iVar3 = U2I(Message,4);
        uVar2 = (unsigned_short)iVar3 - 1;
        if (uVar2 < 0x21) {
          this->GPSEph[uVar2].PRN = (unsigned_short)iVar3;
          this->GPSEph[uVar2].sys = GPS;
          iVar3 = U2I(Message + 0xc,4);
          this->GPSEph[uVar2].HealthStatus = iVar3;
          iVar3 = U2I(Message + 0x18,4);
          this->GPSEph[uVar2].RefTime.Week = iVar3;
          dVar5 = C2D((char *)(Message + 0x20),8);
          this->GPSEph[uVar2].RefTime.SOW = dVar5;
          dVar5 = C2D((char *)(Message + 0x30),8);
          this->GPSEph[uVar2].deltaN = dVar5;
          dVar5 = C2D((char *)(Message + 0x38),8);
          this->GPSEph[uVar2].M0 = dVar5;
          dVar5 = C2D((char *)(Message + 0x28),8);
          dVar5 = sqrt(dVar5);
          this->GPSEph[uVar2].sqrtA = dVar5;
          dVar5 = C2D((char *)(Message + 0x40),8);
          this->GPSEph[uVar2].ecc = dVar5;
          dVar5 = C2D((char *)(Message + 0x48),8);
          this->GPSEph[uVar2].w = dVar5;
          dVar5 = C2D((char *)(Message + 0x50),8);
          this->GPSEph[uVar2].cuc = dVar5;
          dVar5 = C2D((char *)(Message + 0x58),8);
          this->GPSEph[uVar2].cus = dVar5;
          dVar5 = C2D((char *)(Message + 0x60),8);
          this->GPSEph[uVar2].crc = dVar5;
          dVar5 = C2D((char *)(Message + 0x68),8);
          this->GPSEph[uVar2].crs = dVar5;
          dVar5 = C2D((char *)(Message + 0x70),8);
          this->GPSEph[uVar2].cic = dVar5;
          dVar5 = C2D((char *)(Message + 0x78),8);
          this->GPSEph[uVar2].cis = dVar5;
          dVar5 = C2D((char *)(Message + 0x80),8);
          this->GPSEph[uVar2].I0 = dVar5;
          dVar5 = C2D((char *)(Message + 0x88),8);
          this->GPSEph[uVar2].I0Rate = dVar5;
          dVar5 = C2D((char *)(Message + 0x90),8);
          this->GPSEph[uVar2].omegaO = dVar5;
          dVar5 = C2D((char *)(Message + 0x98),8);
          this->GPSEph[uVar2].omegaORate = dVar5;
          iVar3 = U2I(Message + 0xa0,4);
          this->GPSEph[uVar2].iodc = (long)iVar3;
          dVar5 = C2D((char *)(Message + 0xa4),8);
          this->GPSEph[uVar2].toc = dVar5;
          dVar5 = C2D((char *)(Message + 0xac),8);
          this->GPSEph[uVar2].tgd = dVar5;
          dVar5 = C2D((char *)(Message + 0xb4),8);
          this->GPSEph[uVar2].af0 = dVar5;
          dVar5 = C2D((char *)(Message + 0xbc),8);
          this->GPSEph[uVar2].af1 = dVar5;
          dVar5 = C2D((char *)(Message + 0xc4),8);
          this->GPSEph[uVar2].af2 = dVar5;
          dVar5 = C2D((char *)(Message + 0xd8),8);
          this->GPSEph[uVar2].URA = dVar5;
          if (Message != (uchar *)0x0) {
            operator_delete__(Message);
          }
          this_local._4_4_ = 0;
        }
        else {
          this_local._4_4_ = 4;
        }
      }
      else {
        if (Message != (uchar *)0x0) {
          operator_delete__(Message);
        }
        this_local._4_4_ = 3;
      }
    }
  }
  else {
    this_local._4_4_ = 6;
  }
  return this_local._4_4_;
}

Assistant:

int ReadData::ReadGPSEph(BUFF &socketdata, unsigned char* HeadBuff)
{
    if(this->Head.MessageID != 7)
        return CONFLICT_ID;

    if(socketdata.len - socketdata.pos < Head.MessageLength) {
        socketdata.pos -= 28;
        // reset(socketdata, pos);
        return FILE_OR_BUFF_END;
    }
    char* buff = new char [Head.MessageLength + 4];
    memcpy(buff, socketdata.buff + socketdata.pos, Head.MessageLength + 4);
    socketdata.pos += Head.MessageLength + 4;
    try
    {
        if(!CRCCheck(HeadBuff, (unsigned char*)buff, Head.MessageLength, Head.MessageLength)) {
            delete[] buff;
            return CRC_FAILED;
        }
        unsigned short int prn = U2I((unsigned char*)buff, 4) - 1;
        // cout << prn << endl;
        if(prn < 0 || prn > MAXGPSSRN)
            return INVALID_PRN;
        this->GPSEph[prn].PRN = prn + 1;
        this->GPSEph[prn].sys = GPS;

        this->GPSEph[prn].HealthStatus = U2I((unsigned char*)(buff + 12), 4);
        this->GPSEph[prn].RefTime.Week = U2I((unsigned char*)(buff + 24), 4);
        this->GPSEph[prn].RefTime.SOW = C2D(buff + 32, 8);
        this->GPSEph[prn].deltaN = C2D(buff + 48, 8);
        this->GPSEph[prn].M0 = C2D((buff + 56), 8);
        this->GPSEph[prn].sqrtA = sqrt(C2D(buff + 40, 8));
        this->GPSEph[prn].ecc = C2D(buff + 64, 8);
        this->GPSEph[prn].w = C2D(buff + 72, 8);
        this->GPSEph[prn].cuc = C2D(buff + 80, 8);
        this->GPSEph[prn].cus = C2D(buff + 88, 8);
        this->GPSEph[prn].crc = C2D(buff + 96, 8);
        this->GPSEph[prn].crs = C2D(buff + 104, 8);
        this->GPSEph[prn].cic = C2D(buff + 112, 8);
        this->GPSEph[prn].cis = C2D(buff + 120, 8);
        this->GPSEph[prn].I0 = C2D(buff + 128, 8);
        this->GPSEph[prn].I0Rate = C2D(buff + 136, 8);
        this->GPSEph[prn].omegaO = C2D(buff + 144, 8);
        this->GPSEph[prn].omegaORate  = C2D(buff + 152, 8);
        this->GPSEph[prn].iodc = U2I((unsigned char*)buff + 160, 4);
        this->GPSEph[prn].toc = C2D(buff + 164, 8);
        this->GPSEph[prn].tgd = C2D(buff + 172, 8);
        this->GPSEph[prn].af0 = C2D(buff + 180, 8);
        this->GPSEph[prn].af1 = C2D(buff + 188, 8);
        this->GPSEph[prn].af2 = C2D(buff + 196, 8);
        this->GPSEph[prn].URA = C2D(buff + 216, 8);
        // cout << setprecision(15) << GPSEph[prn].omega << endl;
    }
    catch(...)
    {
        cout << "error happened when reading GPS ehpe" << endl;
        return UNKNOWN_ERROR;
    }
    
    delete [] buff;

    return 0;
}